

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.cc
# Opt level: O2

void __thiscall
draco::MeshAttributeCornerTable::AddSeamEdge(MeshAttributeCornerTable *this,CornerIndex c)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  uint uVar1;
  size_type __n;
  size_type sVar2;
  uint uVar3;
  reference rVar4;
  
  __n = 0xffffffff;
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    (&this->is_edge_on_seam_,(ulong)c.value_);
  *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
  this_00 = &this->is_vertex_on_seam_;
  sVar2 = 0xffffffff;
  if (c.value_ != 0xffffffff) {
    uVar3 = c.value_ - 2;
    if ((c.value_ + 1) % 3 != 0) {
      uVar3 = c.value_ + 1;
    }
    if (uVar3 != 0xffffffff) {
      sVar2 = (size_type)
              (this->corner_table_->corner_to_vertex_map_).vector_.
              super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar3].value_;
    }
  }
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,sVar2);
  *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
  if (c.value_ == 0xffffffff) goto LAB_0013e139;
  if (c.value_ % 3 == 0) {
    uVar3 = c.value_ + 2;
    sVar2 = 0xffffffff;
    if (uVar3 != 0xffffffff) goto LAB_0013e092;
  }
  else {
    uVar3 = c.value_ - 1;
LAB_0013e092:
    sVar2 = (size_type)
            (this->corner_table_->corner_to_vertex_map_).vector_.
            super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar3].value_;
  }
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,sVar2);
  *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
  uVar3 = (this->corner_table_->opposite_corners_).vector_.
          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[c.value_].value_;
  if ((ulong)uVar3 == 0xffffffff) {
    return;
  }
  this->no_interior_seams_ = false;
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->is_edge_on_seam_,(ulong)uVar3)
  ;
  *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
  uVar1 = uVar3 - 2;
  if ((uVar3 + 1) % 3 != 0) {
    uVar1 = uVar3 + 1;
  }
  sVar2 = 0xffffffff;
  if (uVar1 != 0xffffffff) {
    sVar2 = (size_type)
            (this->corner_table_->corner_to_vertex_map_).vector_.
            super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar1].value_;
  }
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,sVar2);
  *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
  if (uVar3 % 3 == 0) {
    uVar3 = uVar3 + 2;
    if (uVar3 == 0xffffffff) goto LAB_0013e139;
  }
  else {
    uVar3 = uVar3 - 1;
  }
  __n = (size_type)
        (this->corner_table_->corner_to_vertex_map_).vector_.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar3].value_;
LAB_0013e139:
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,__n);
  *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
  return;
}

Assistant:

void MeshAttributeCornerTable::AddSeamEdge(CornerIndex c) {
  DRACO_DCHECK(GetValenceCache().IsCacheEmpty());
  is_edge_on_seam_[c.value()] = true;
  // Mark seam vertices.
  is_vertex_on_seam_[corner_table_->Vertex(corner_table_->Next(c)).value()] =
      true;
  is_vertex_on_seam_[corner_table_->Vertex(corner_table_->Previous(c))
                         .value()] = true;

  const CornerIndex opp_corner = corner_table_->Opposite(c);
  if (opp_corner != kInvalidCornerIndex) {
    no_interior_seams_ = false;
    is_edge_on_seam_[opp_corner.value()] = true;
    is_vertex_on_seam_[corner_table_->Vertex(corner_table_->Next(opp_corner))
                           .value()] = true;
    is_vertex_on_seam_
        [corner_table_->Vertex(corner_table_->Previous(opp_corner)).value()] =
            true;
  }
}